

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void __thiscall wallet::coinselector_tests::bump_fee_test::test_method(bump_fee_test *this)

{
  undefined8 *puVar1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  iterator pvVar6;
  iterator in_R9;
  CAmount *pCVar7;
  long lVar8;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  CAmount local_120;
  char *local_118;
  char *local_110;
  undefined **local_108;
  undefined1 local_100;
  undefined1 *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  CAmount expected_waste;
  vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  inputs;
  SelectionResult selection;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = &selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection.m_target = 200000000;
  selection.m_algo = MANUAL;
  selection.m_use_effective = false;
  selection.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection.m_algo_completed = true;
  selection.m_weight = 0;
  selection.bump_fee_group_discount = 0;
  local_108 = (undefined **)0x5f5e100;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  add_coin((CAmount *)&local_108,1,&selection,100,0x8c);
  local_108 = (undefined **)0xbebc200;
  pvVar6 = (iterator)0x8c;
  add_coin((CAmount *)&local_108,2,&selection,100,0x8c);
  SelectionResult::GetShuffledInputVector(&inputs,&selection);
  uVar4 = 0xffffffffffffffff;
  lVar8 = 0;
  lVar5 = 0x14;
  while( true ) {
    uVar4 = uVar4 + 1;
    if ((ulong)((long)inputs.
                      super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)inputs.
                      super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar4) break;
    puVar1 = (undefined8 *)
             ((long)&((inputs.
                       super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar8
             );
    lVar8 = lVar8 + 0x10;
    COutput::ApplyBumpFee((COutput *)*puVar1,lVar5);
    lVar5 = lVar5 + 0x14;
  }
  SelectionResult::RecalculateWaste(&selection,200,0x7d,0x23);
  expected_waste = 0x69;
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = pvVar6;
  file.m_end = (iterator)0x403;
  file.m_begin = (iterator)&local_d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e8,msg);
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_01139f30;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_110 = "";
  local_120 = SelectionResult::GetWaste(&selection);
  pvVar6 = (iterator)0x2;
  pCVar7 = &expected_waste;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_108,&local_118,0x403,1,2,pCVar7,"expected_waste",&local_120,
             "selection.GetWaste()");
  SelectionResult::SetBumpFeeDiscount(&selection,0x1e);
  SelectionResult::RecalculateWaste(&selection,200,0x7d,0x23);
  expected_waste = 0x4b;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pCVar7;
  msg_00.m_begin = pvVar6;
  file_00.m_end = (iterator)0x408;
  file_00.m_begin = (iterator)&local_130;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
             msg_00);
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_01139f30;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_150 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_148 = "";
  local_120 = SelectionResult::GetWaste(&selection);
  pCVar7 = &expected_waste;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_108,&local_150,0x408,1,2,pCVar7,"expected_waste",&local_120,
             "selection.GetWaste()");
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~vector(&inputs);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection);
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  selection.m_target = 0x11e1a1d4;
  selection.m_algo = MANUAL;
  selection.m_use_effective = false;
  selection.m_waste.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  selection.m_algo_completed = true;
  selection.m_weight = 0;
  selection.bump_fee_group_discount = 0;
  local_108 = (undefined **)0x5f5e100;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  selection.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  add_coin((CAmount *)&local_108,1,&selection,100,0x8c);
  local_108 = (undefined **)0xbebc200;
  pvVar6 = (iterator)0x8c;
  add_coin((CAmount *)&local_108,2,&selection,100,0x8c);
  SelectionResult::GetShuffledInputVector(&inputs,&selection);
  uVar4 = 0xffffffffffffffff;
  lVar8 = 0;
  lVar5 = 0x14;
  while( true ) {
    uVar4 = uVar4 + 1;
    if ((ulong)((long)inputs.
                      super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)inputs.
                      super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar4) break;
    puVar1 = (undefined8 *)
             ((long)&((inputs.
                       super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar8
             );
    lVar8 = lVar8 + 0x10;
    COutput::ApplyBumpFee((COutput *)*puVar1,lVar5);
    lVar5 = lVar5 + 0x14;
  }
  SelectionResult::RecalculateWaste(&selection,200,0x7d,0x23);
  expected_waste = 0x14;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pCVar7;
  msg_01.m_begin = pvVar6;
  file_01.m_end = (iterator)0x41d;
  file_01.m_begin = (iterator)&local_160;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_170,
             msg_01);
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_01139f30;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_178 = "";
  local_120 = SelectionResult::GetWaste(&selection);
  pvVar6 = (iterator)0x2;
  pCVar7 = &expected_waste;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_108,&local_180,0x41d,1,2,pCVar7,"expected_waste",&local_120,
             "selection.GetWaste()");
  SelectionResult::SetBumpFeeDiscount(&selection,0x1e);
  SelectionResult::RecalculateWaste(&selection,200,0x7d,0x23);
  expected_waste = 0x14;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pCVar7;
  msg_02.m_begin = pvVar6;
  file_02.m_end = (iterator)0x422;
  file_02.m_begin = (iterator)&local_190;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a0,
             msg_02);
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_01139f30;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_1a8 = "";
  local_120 = SelectionResult::GetWaste(&selection);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_108,&local_1b0,0x422,1,2,&expected_waste,"expected_waste",&local_120,
             "selection.GetWaste()");
  std::vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~vector(&inputs);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
               *)&selection);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bump_fee_test)
{
    const CAmount fee{100};
    const CAmount min_viable_change{200};
    const CAmount change_cost{125};
    const CAmount change_fee{35};
    const CAmount fee_diff{40};
    const CAmount target{2 * COIN};

    {
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, /*fee=*/fee, /*long_term_fee=*/fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        const std::vector<std::shared_ptr<COutput>> inputs = selection.GetShuffledInputVector();

        for (size_t i = 0; i < inputs.size(); ++i) {
            inputs[i]->ApplyBumpFee(20*(i+1));
        }

        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        CAmount expected_waste = fee_diff * -2 + change_cost + /*bump_fees=*/60;
        BOOST_CHECK_EQUAL(expected_waste, selection.GetWaste());

        selection.SetBumpFeeDiscount(30);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        expected_waste = fee_diff * -2 + change_cost + /*bump_fees=*/60 - /*group_discount=*/30;
        BOOST_CHECK_EQUAL(expected_waste, selection.GetWaste());
    }

    {
        // Test with changeless transaction
        //
        // Bump fees and excess both contribute fully to the waste score,
        // therefore, a bump fee group discount will not change the waste
        // score as long as we do not create change in both instances.
        CAmount changeless_target = 3 * COIN - 2 * fee - 100;
        SelectionResult selection{changeless_target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, /*fee=*/fee, /*long_term_fee=*/fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        const std::vector<std::shared_ptr<COutput>> inputs = selection.GetShuffledInputVector();

        for (size_t i = 0; i < inputs.size(); ++i) {
            inputs[i]->ApplyBumpFee(20*(i+1));
        }

        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        CAmount expected_waste = fee_diff * -2 + /*bump_fees=*/60 + /*excess = 100 - bump_fees*/40;
        BOOST_CHECK_EQUAL(expected_waste, selection.GetWaste());

        selection.SetBumpFeeDiscount(30);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        expected_waste = fee_diff * -2 + /*bump_fees=*/60 - /*group_discount=*/30 + /*excess = 100 - bump_fees + group_discount*/70;
        BOOST_CHECK_EQUAL(expected_waste, selection.GetWaste());
    }
}